

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

void bumpActivity(saucy *s,sim_result *cex)

{
  int iVar1;
  void *pvVar2;
  double dVar3;
  sim_result *cex2;
  int i;
  sim_result *cex_local;
  saucy *s_local;
  
  dVar3 = s->activityInc + cex->activity;
  cex->activity = dVar3;
  if (1e+20 < dVar3) {
    cex2._4_4_ = 0;
    while( true ) {
      iVar1 = Vec_PtrSize(s->satCounterExamples);
      if (iVar1 <= cex2._4_4_) break;
      pvVar2 = Vec_PtrEntry(s->satCounterExamples,cex2._4_4_);
      *(double *)((long)pvVar2 + 0x18) = *(double *)((long)pvVar2 + 0x18) * 1e-20;
      cex2._4_4_ = cex2._4_4_ + 1;
    }
    s->activityInc = s->activityInc * 1e-20;
  }
  return;
}

Assistant:

static void 
bumpActivity( struct saucy * s, struct sim_result * cex )
{
    int i;
    struct sim_result * cex2;

    if ( (cex->activity += s->activityInc) > 1e20 ) {
        /* Rescale: */
        for (i = 0; i < Vec_PtrSize(s->satCounterExamples); i++) {
            cex2 = (struct sim_result *)Vec_PtrEntry(s->satCounterExamples, i);
            cex2->activity *= 1e-20;
        }
        s->activityInc *= 1e-20; 
    } 
}